

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O3

void __thiscall
MeterPrivate::drawBackground(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  double dVar1;
  QBrush local_30 [8];
  
  QPainter::save();
  QPainter::setPen((QColor *)painter);
  QBrush::QBrush(local_30,&this->backgroundColor,1);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush(local_30);
  dVar1 = (double)(this->radius * 2);
  (params->rect).xp = 0.0;
  (params->rect).yp = 0.0;
  (params->rect).w = dVar1;
  (params->rect).h = dVar1;
  QPainter::drawEllipse((QRectF *)painter);
  QPainter::restore();
  return;
}

Assistant:

void
MeterPrivate::drawBackground( QPainter & painter, DrawParams & params )
{
	painter.save();
	painter.setPen( backgroundColor );
	painter.setBrush( backgroundColor );
	params.rect = QRectF( 0.0, 0.0, radius * 2, radius * 2 );
	painter.drawEllipse( params.rect );
	painter.restore();
}